

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O0

void P_InitSectorSpecial(sector_t *sector,int special)

{
  sector_t *sector_00;
  int iVar1;
  DDoor *pDVar2;
  undefined4 in_register_00000034;
  size_t len;
  double dy;
  double dx;
  FName local_68;
  int i;
  FName local_60;
  FName local_5c;
  FName local_58;
  FName local_54;
  FName local_50;
  FName local_4c;
  FName local_48;
  FName local_44;
  FName local_40 [4];
  FName local_30;
  FName local_2c;
  FName local_28;
  byte local_21;
  FName local_20;
  bool keepspecial;
  FName local_18;
  int local_14;
  sector_t *psStack_10;
  int special_local;
  sector_t *sector_local;
  
  len = CONCAT44(in_register_00000034,special);
  if ((sector->special & 0x400U) != 0) {
    sector->Flags = sector->Flags | 0xc0000000;
    level.total_secrets = level.total_secrets + 1;
  }
  if ((sector->special & 0x800U) != 0) {
    sector->Flags = sector->Flags | 0x10;
  }
  if ((sector->special & 0x1000U) != 0) {
    sector->Flags = sector->Flags | 0x20;
  }
  local_14 = special;
  psStack_10 = sector;
  if ((sector->special & 0x300U) == 0x100) {
    FName::FName(&local_18,NAME_Fire);
    len = 5;
    P_SetupSectorDamage(sector,5,0x20,0,&local_18,0);
  }
  else if ((sector->special & 0x300U) == 0x200) {
    FName::FName((FName *)&stack0xffffffffffffffe4,NAME_Slime);
    len = 10;
    P_SetupSectorDamage(sector,10,0x20,0,(FName *)&stack0xffffffffffffffe4,0);
  }
  else if ((sector->special & 0x300U) == 0x300) {
    FName::FName(&local_20,NAME_Slime);
    len = 0x14;
    P_SetupSectorDamage(sector,0x14,0x20,5,&local_20,0);
  }
  psStack_10->special = (ushort)(byte)psStack_10->special;
  local_21 = 0;
  P_SpawnLights(psStack_10);
  sector_00 = psStack_10;
  switch(psStack_10->special) {
  case 0x44:
    FName::FName(&local_28,NAME_Slime);
    P_SetupSectorDamage(sector_00,0x14,0x20,5,&local_28,0);
    break;
  case 0x45:
    FName::FName(&local_2c,NAME_Slime);
    P_SetupSectorDamage(sector_00,10,0x20,0,&local_2c,0);
    break;
  default:
    if ((psStack_10->special < 0xc9) || (0xe0 < psStack_10->special)) {
      if ((0xe0 < psStack_10->special) && (psStack_10->special < 0xe6)) {
        P_CreateScroller(sc_floor,(double)(1 << ((char)psStack_10->special + 0x1fU & 0x1f)) * -0.5,
                         0.0,-1,(int)(((long)psStack_10 - (long)sectors) / 0x218),0,scw_all);
      }
    }
    else {
      iVar1 = psStack_10->special + -0xc9;
      P_CreateScroller(sc_floor,(double)(int)P_InitSectorSpecial::hexenScrollies[iVar1][0] / 2.0,
                       (double)(int)P_InitSectorSpecial::hexenScrollies[iVar1][1] / 2.0,-1,
                       (int)(((long)psStack_10 - (long)sectors) / 0x218),0,scw_all);
    }
    local_21 = 1;
    break;
  case 0x47:
    FName::FName(&local_30,NAME_Slime);
    P_SetupSectorDamage(sector_00,5,0x20,0,&local_30,0);
    break;
  case 0x4a:
    pDVar2 = (DDoor *)DObject::operator_new((DObject *)0x88,len);
    DDoor::DDoor(pDVar2,psStack_10,doorWaitClose,2.0,0,0,0x41a);
    break;
  case 0x4b:
    FName::FName(local_40,NAME_None);
    P_SetupSectorDamage(sector_00,0x14,0x20,0x100,local_40,0x300);
    break;
  case 0x4e:
    pDVar2 = (DDoor *)DObject::operator_new((DObject *)0x88,len);
    DDoor::DDoor(pDVar2,psStack_10,doorWaitRaise,2.0,0x96,0,0x2904);
    break;
  case 0x4f:
    psStack_10->friction = 0.97265625;
    psStack_10->movefactor = 0.0094146728515625;
    psStack_10->Flags = psStack_10->Flags | 0x10;
    break;
  case 0x50:
    FName::FName(&local_44,NAME_Slime);
    P_SetupSectorDamage(sector_00,0x14,0x20,5,&local_44,0);
    break;
  case 0x52:
    FName::FName(&local_48,NAME_Fire);
    P_SetupSectorDamage(sector_00,5,0x20,0x100,&local_48,0x80);
    break;
  case 0x53:
    FName::FName(&local_4c,NAME_Fire);
    P_SetupSectorDamage(sector_00,8,0x20,0x100,&local_4c,0x80);
    break;
  case 0x54:
    FName::FName(&local_50,NAME_Fire);
    P_SetupSectorDamage(sector_00,5,0x20,0x100,&local_50,0x80);
    P_CreateScroller(sc_floor,-4.0,0.0,-1,(int)(((long)psStack_10 - (long)sectors) / 0x218),0,
                     scw_all);
    local_21 = 1;
    break;
  case 0x55:
    FName::FName(&local_54,NAME_Slime);
    P_SetupSectorDamage(sector_00,4,0x20,0,&local_54,0);
    break;
  case 0x68:
    FName::FName(&local_58,NAME_Slime);
    P_SetupSectorDamage(sector_00,5,0x20,0,&local_58,0);
    break;
  case 0x69:
    FName::FName(&local_5c,NAME_Slime);
    P_SetupSectorDamage(sector_00,2,0x20,0,&local_5c,0x400);
    break;
  case 0x73:
    FName::FName(&local_60,NAME_InstantDeath);
    P_SetupSectorDamage(sector_00,1000000,1,0x100,&local_60,0);
    break;
  case 0x74:
    FName::FName((FName *)&i,NAME_Slime);
    P_SetupSectorDamage(sector_00,4,0x20,0,(FName *)&i,0x400);
    break;
  case 0xc3:
    psStack_10->MoreFlags = psStack_10->MoreFlags | 0x100;
    break;
  case 0xc4:
    FName::FName(&local_68,NAME_None);
    P_SetupSectorDamage(sector_00,-1,0x20,0,&local_68,0);
    break;
  case 200:
    psStack_10->sky = 0x40000000;
  }
  if ((local_21 & 1) == 0) {
    psStack_10->special = 0;
  }
  return;
}

Assistant:

void P_InitSectorSpecial(sector_t *sector, int special)
{
	// [RH] All secret sectors are marked with a BOOM-ish bitfield
	if (sector->special & SECRET_MASK)
	{
		sector->Flags |= SECF_SECRET | SECF_WASSECRET;
		level.total_secrets++;
	}
	if (sector->special & FRICTION_MASK)
	{
		sector->Flags |= SECF_FRICTION;
	}
	if (sector->special & PUSH_MASK)
	{
		sector->Flags |= SECF_PUSH;
	}
	if ((sector->special & DAMAGE_MASK) == 0x100)
	{
		P_SetupSectorDamage(sector, 5, 32, 0, NAME_Fire, 0);
	}
	else if ((sector->special & DAMAGE_MASK) == 0x200)
	{
		P_SetupSectorDamage(sector, 10, 32, 0, NAME_Slime, 0);
	}
	else if ((sector->special & DAMAGE_MASK) == 0x300)
	{
		P_SetupSectorDamage(sector, 20, 32, 5, NAME_Slime, 0);
	}
	sector->special &= 0xff;

	// [RH] Normal DOOM special or BOOM specialized?
	bool keepspecial = false;
	P_SpawnLights(sector);
	switch (sector->special)
	{
	case dLight_Strobe_Hurt:
		P_SetupSectorDamage(sector, 20, 32, 5, NAME_Slime, 0);
		break;

	case dDamage_Hellslime:
		P_SetupSectorDamage(sector, 10, 32, 0, NAME_Slime, 0);
		break;

	case dDamage_Nukage:
		P_SetupSectorDamage(sector, 5, 32, 0, NAME_Slime, 0);
		break;

	case dSector_DoorCloseIn30:
		new DDoor(sector, DDoor::doorWaitClose, 2, 0, 0, 30 * TICRATE);
		break;
			
	case dDamage_End:
		P_SetupSectorDamage(sector, 20, 32, 256, NAME_None, SECF_ENDGODMODE|SECF_ENDLEVEL);
		break;

	case dSector_DoorRaiseIn5Mins:
		new DDoor (sector, DDoor::doorWaitRaise, 2, TICRATE*30/7, 0, 5*60*TICRATE);
		break;

	case dFriction_Low:
		sector->friction = FRICTION_LOW;
		sector->movefactor = 0x269/65536.;
		sector->Flags |= SECF_FRICTION;
		break;

	case dDamage_SuperHellslime:
		P_SetupSectorDamage(sector, 20, 32, 5, NAME_Slime, 0);
		break;

	case dDamage_LavaWimpy:
		P_SetupSectorDamage(sector, 5, 32, 256, NAME_Fire, SECF_DMGTERRAINFX);
		break;

	case dDamage_LavaHefty:
		P_SetupSectorDamage(sector, 8, 32, 256, NAME_Fire, SECF_DMGTERRAINFX);
		break;

	case dScroll_EastLavaDamage:
		P_SetupSectorDamage(sector, 5, 32, 256, NAME_Fire, SECF_DMGTERRAINFX);
		P_CreateScroller(EScroll::sc_floor, -4., 0, -1, int(sector - sectors), 0);
		keepspecial = true;
		break;

	case hDamage_Sludge:
		P_SetupSectorDamage(sector, 4, 32, 0, NAME_Slime, 0);
		break;

	case sLight_Strobe_Hurt:
		P_SetupSectorDamage(sector, 5, 32, 0, NAME_Slime, 0);
		break;

	case sDamage_Hellslime:
		P_SetupSectorDamage(sector, 2, 32, 0, NAME_Slime, SECF_HAZARD);
		break;

	case Damage_InstantDeath:
		// Strife's instant death sector
		P_SetupSectorDamage(sector, TELEFRAG_DAMAGE, 1, 256, NAME_InstantDeath, 0);
		break;

	case sDamage_SuperHellslime:
		P_SetupSectorDamage(sector, 4, 32, 0, NAME_Slime, SECF_HAZARD);
		break;

	case Sector_Hidden:
		sector->MoreFlags |= SECF_HIDDEN;
		break;

	case Sector_Heal:
		// CoD's healing sector
		P_SetupSectorDamage(sector, -1, 32, 0, NAME_None, 0);
		break;

	case Sky2:
		sector->sky = PL_SKYFLAT;
		break;

	default:
		if (sector->special >= Scroll_North_Slow &&
			sector->special <= Scroll_SouthWest_Fast)
		{ // Hexen scroll special
			static const SBYTE hexenScrollies[24][2] =
			{
				{  0,  1 }, {  0,  2 }, {  0,  4 },
				{ -1,  0 }, { -2,  0 }, { -4,  0 },
				{  0, -1 }, {  0, -2 }, {  0, -4 },
				{  1,  0 }, {  2,  0 }, {  4,  0 },
				{  1,  1 }, {  2,  2 }, {  4,  4 },
				{ -1,  1 }, { -2,  2 }, { -4,  4 },
				{ -1, -1 }, { -2, -2 }, { -4, -4 },
				{  1, -1 }, {  2, -2 }, {  4, -4 }
			};

			
			int i = sector->special - Scroll_North_Slow;
			double dx = hexenScrollies[i][0] / 2.;
			double dy = hexenScrollies[i][1] / 2.;
			P_CreateScroller(EScroll::sc_floor, dx, dy, -1, int(sector-sectors), 0);
		}
		else if (sector->special >= Carry_East5 &&
					sector->special <= Carry_East35)
		{ // Heretic scroll special
			// Only east scrollers also scroll the texture
			P_CreateScroller(EScroll::sc_floor,
				-0.5 * (1 << ((sector->special & 0xff) - Carry_East5)),	0, -1, int(sector-sectors), 0);
		}
		keepspecial = true;
		break;
	}
	if (!keepspecial) sector->special = 0;
}